

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrandomopentest.c
# Opt level: O2

int main(int argc,char **argv)

{
  zip_uint8_t *pzVar1;
  char cVar2;
  long lVar3;
  char *__ptr;
  size_t sStack_410;
  zip_uint8_t buf [1024];
  
  cVar2 = zip_secure_random(buf,0x400);
  if (cVar2 == '\0') {
    __ptr = "zip_secure_random returned false\n";
    sStack_410 = 0x21;
  }
  else {
    lVar3 = 0;
    do {
      if (lVar3 == 0x400) {
        exit(0);
      }
      pzVar1 = buf + lVar3;
      lVar3 = lVar3 + 1;
    } while (*pzVar1 == '\0');
    __ptr = "non-zero byte found\n";
    sStack_410 = 0x14;
  }
  fwrite(__ptr,sStack_410,1,_stderr);
  exit(1);
}

Assistant:

int
main(int argc, const char *argv[]) {
    zip_uint8_t buf[1024];
    int i;

#ifdef HAVE_CRYPTO
    if (!zip_secure_random(buf, sizeof(buf))) {
	fprintf(stderr, "zip_secure_random returned false\n");
	exit(1);
    }
    for (i = 0; i < sizeof(buf); i++) {
	if (buf[i] != 0) {
	    fprintf(stderr, "non-zero byte found\n");
	    exit(1);
	}
    }
#endif
    exit(0);
}